

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

uint makeseed(lua_State *L)

{
  uint uVar1;
  time_t tVar2;
  size_t t_3;
  size_t t_2;
  size_t t_1;
  size_t t;
  int p;
  uint h;
  char buff [32];
  lua_State *L_local;
  
  tVar2 = time((time_t *)0x0);
  t._4_4_ = (uint)tVar2;
  buff._0_8_ = (long)&t + 4;
  buff._8_8_ = &luaO_nilobject_;
  buff._16_8_ = lua_newstate;
  t._0_4_ = 0x20;
  _p = L;
  uVar1 = luaS_hash((char *)&p,0x20,t._4_4_);
  return uVar1;
}

Assistant:

static unsigned int makeseed (lua_State *L) {
  char buff[4 * sizeof(size_t)];
  unsigned int h = luai_makeseed();
  int p = 0;
  addbuff(buff, p, L);  /* heap variable */
  addbuff(buff, p, &h);  /* local variable */
  addbuff(buff, p, luaO_nilobject);  /* global variable */
  addbuff(buff, p, &lua_newstate);  /* public function */
  lua_assert(p == sizeof(buff));
  return luaS_hash(buff, p, h);
}